

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_node_ext(lyd_node *node,ly_set *ext_node)

{
  lysc_ext_instance *plVar1;
  lyplg_ext *plVar2;
  LY_ERR LVar3;
  void *pvVar4;
  undefined8 *object;
  void *pvVar5;
  lysc_ext_instance *plVar6;
  lys_module *plVar7;
  
  plVar1 = node->schema->exts;
  pvVar5 = (void *)0x0;
  plVar6 = plVar1;
  do {
    if (plVar1 == (lysc_ext_instance *)0x0) {
      pvVar4 = (void *)0x0;
    }
    else {
      pvVar4 = plVar1[-1].compiled;
    }
    if (pvVar4 <= pvVar5) {
      return LY_SUCCESS;
    }
    plVar2 = plVar6->def->plugin;
    if ((plVar2 != (lyplg_ext *)0x0) && (plVar2->node != (lyplg_ext_data_node_clb)0x0)) {
      object = (undefined8 *)malloc(0x10);
      if (object == (undefined8 *)0x0) {
        if (node->schema == (lysc_node *)0x0) {
          plVar7 = (lys_module *)&node[2].schema;
        }
        else {
          plVar7 = node->schema->module;
        }
        ly_log(plVar7->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyd_validate_node_ext");
        return LY_EMEM;
      }
      *object = plVar6;
      object[1] = node;
      LVar3 = ly_set_add(ext_node,object,'\x01',(uint32_t *)0x0);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    pvVar5 = (void *)((long)pvVar5 + 1);
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

LY_ERR
lyd_validate_node_ext(struct lyd_node *node, struct ly_set *ext_node)
{
    struct lyd_ctx_ext_node *ext_n;
    struct lysc_ext_instance *exts;
    LY_ARRAY_COUNT_TYPE u;

    /* try to find a relevant extension instance with node callback */
    exts = node->schema->exts;
    LY_ARRAY_FOR(exts, u) {
        if (exts[u].def->plugin && exts[u].def->plugin->node) {
            /* store for validation */
            ext_n = malloc(sizeof *ext_n);
            LY_CHECK_ERR_RET(!ext_n, LOGMEM(LYD_CTX(node)), LY_EMEM);
            ext_n->ext = &exts[u];
            ext_n->node = node;
            LY_CHECK_RET(ly_set_add(ext_node, ext_n, 1, NULL));
        }
    }

    return LY_SUCCESS;
}